

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::FunctionBreakpoint>::construct
          (BasicTypeInfo<dap::FunctionBreakpoint> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::FunctionBreakpoint> *this_local;
  
  memset(ptr,0,0x70);
  FunctionBreakpoint::FunctionBreakpoint((FunctionBreakpoint *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }